

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O2

void __thiscall FastPForLib::CSVFlatFile::CSVFlatFile(CSVFlatFile *this,char *filename,int normtype)

{
  ostream *poVar1;
  allocator local_49;
  string local_48;
  
  std::ifstream::ifstream(this);
  std::__cxx11::string::string((string *)&local_48,",",&local_49);
  CSVReader::CSVReader(&this->mainreader,(istream *)0x0,&local_48,'#');
  std::__cxx11::string::~string((string *)&local_48);
  (this->mapping).
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mapping).
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mapping).
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->NumberOfLines = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"# computing normalization of file ");
  poVar1 = std::operator<<(poVar1,filename);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (normtype == 1) {
    computeDomainNormalization(this,filename);
  }
  else if (normtype == 0) {
    computeFreqNormalization(this,filename);
  }
  std::ifstream::open((char *)this,(_Ios_Openmode)filename);
  (this->mainreader).mIn = (istream *)this;
  return;
}

Assistant:

CSVFlatFile(const char *filename, const int normtype)
      : in(), mainreader(NULL), mapping(), NumberOfLines(0) {
    std::cout << "# computing normalization of file " << filename << std::endl;
    if (normtype == FREQNORMALISATION)
      computeFreqNormalization(filename);
    else if (normtype == DOMAINNORMALISATION)
      computeDomainNormalization(filename);
    in.open(filename);
    mainreader.linkStream(&in);
  }